

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

handle pybind11::detail::get_function(handle value)

{
  bool bVar1;
  int iVar2;
  PyObject **ppPVar3;
  handle local_28;
  handle local_20;
  handle local_18;
  handle value_local;
  
  local_18.m_ptr = value.m_ptr;
  bVar1 = pybind11::handle::operator_cast_to_bool(&local_18);
  if (bVar1) {
    ppPVar3 = pybind11::handle::ptr(&local_18);
    iVar2 = ::_Py_IS_TYPE(*ppPVar3,(PyTypeObject *)&PyInstanceMethod_Type);
    if (iVar2 == 0) {
      ppPVar3 = pybind11::handle::ptr(&local_18);
      iVar2 = ::_Py_IS_TYPE(*ppPVar3,(PyTypeObject *)&PyMethod_Type);
      if (iVar2 != 0) {
        ppPVar3 = pybind11::handle::ptr(&local_18);
        pybind11::handle::handle(&local_28,(PyObject *)(*ppPVar3)[1].ob_refcnt);
        local_18.m_ptr = local_28.m_ptr;
      }
    }
    else {
      ppPVar3 = pybind11::handle::ptr(&local_18);
      pybind11::handle::handle(&local_20,(PyObject *)(*ppPVar3)[1].ob_refcnt);
      local_18.m_ptr = local_20.m_ptr;
    }
  }
  return (handle)local_18.m_ptr;
}

Assistant:

inline handle get_function(handle value) {
    if (value) {
#if PY_MAJOR_VERSION >= 3
        if (PyInstanceMethod_Check(value.ptr()))
            value = PyInstanceMethod_GET_FUNCTION(value.ptr());
        else
#endif
        if (PyMethod_Check(value.ptr()))
            value = PyMethod_GET_FUNCTION(value.ptr());
    }
    return value;
}